

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_parse(int argc,char **argv,void **argtable)

{
  byte bVar1;
  arg_end *endtable;
  code *pcVar2;
  int iVar3;
  long lVar4;
  char **nargv;
  size_t sVar5;
  char *pcVar6;
  int *__ptr;
  size_t sVar7;
  char *pcVar8;
  byte *pbVar9;
  void **ppvVar10;
  char *pcVar11;
  int *piVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  char cVar16;
  void *pvVar17;
  void *pvVar18;
  arg_hdr *hdr;
  int *piVar19;
  int *piVar20;
  byte *pbVar22;
  arg_hdr **table;
  int *piVar21;
  
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    if (*(code **)(pbVar9 + 0x38) != (code *)0x0) {
      (**(code **)(pbVar9 + 0x38))(*(undefined8 *)(pbVar9 + 0x30));
      pbVar9 = (byte *)*ppvVar10;
    }
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  lVar4 = -0x100000000;
  ppvVar10 = argtable;
  do {
    pbVar9 = (byte *)*ppvVar10;
    lVar4 = lVar4 + 0x100000000;
    ppvVar10 = ppvVar10 + 1;
  } while ((*pbVar9 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar4 >> 0x1d));
  if (argc == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
  }
  else {
    nargv = (char **)malloc((long)argc * 8 + 8);
    if (nargv == (char **)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    if (0 < argc) {
      memcpy(nargv,argv,(ulong)(uint)argc << 3);
    }
    nargv[argc] = (char *)0x0;
    iVar15 = 1;
    lVar13 = 0;
    lVar4 = 0;
    do {
      pbVar9 = (byte *)argtable[lVar13];
      pcVar6 = *(char **)(pbVar9 + 0x10);
      if (pcVar6 != (char *)0x0) {
        sVar5 = strlen(pcVar6);
        do {
          iVar15 = iVar15 + 1;
          pcVar6 = strchr(pcVar6 + 1,0x2c);
        } while (pcVar6 != (char *)0x0);
        lVar4 = lVar4 + sVar5;
      }
      lVar4 = lVar4 + 1;
      lVar13 = lVar13 + 1;
    } while ((*pbVar9 & 1) == 0);
    __ptr = (int *)malloc(lVar4 + (long)iVar15 * 0x20 + 0x10);
    if (__ptr == (int *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    *__ptr = 0;
    __ptr[1] = iVar15;
    piVar12 = __ptr + 4;
    *(int **)(__ptr + 2) = piVar12;
    pbVar9 = (byte *)*argtable;
    if ((*pbVar9 & 1) == 0) {
      piVar19 = piVar12 + (long)iVar15 * 8;
      lVar4 = 0;
      lVar13 = 0;
      do {
        pcVar6 = *(char **)(pbVar9 + 0x10);
        if ((pcVar6 != (char *)0x0) && (cVar16 = *pcVar6, cVar16 != '\0')) {
          lVar13 = (long)(int)lVar13;
          piVar20 = piVar19;
          piVar21 = piVar19;
          do {
            while ((piVar19 = (int *)((long)piVar20 + 1), cVar16 != '\0' && (cVar16 != ','))) {
              *(char *)piVar20 = cVar16;
              pcVar8 = pcVar6 + 1;
              pcVar6 = pcVar6 + 1;
              piVar20 = piVar19;
              cVar16 = *pcVar8;
            }
            *(undefined1 *)piVar20 = 0;
            cVar16 = *pcVar6;
            piVar12 = *(int **)(__ptr + 2);
            *(int **)(piVar12 + lVar13 * 8) = piVar21;
            *(int **)(piVar12 + lVar13 * 8 + 4) = __ptr;
            piVar12[lVar13 * 8 + 6] = (int)lVar4;
            if ((*argtable[lVar4] & 4) == 0) {
              if ((*argtable[lVar4] & 2) == 0) {
                piVar12[lVar13 * 8 + 2] = 0;
              }
              else {
                piVar12[lVar13 * 8 + 2] = 1;
              }
            }
            else {
              piVar12[lVar13 * 8 + 2] = 2;
            }
            pcVar6 = pcVar6 + (cVar16 == ',');
            lVar13 = lVar13 + 1;
            cVar16 = *pcVar6;
            piVar20 = piVar19;
            piVar21 = piVar19;
          } while (cVar16 != '\0');
        }
        pbVar9 = (byte *)argtable[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while ((*pbVar9 & 1) == 0);
      lVar4 = (long)(int)lVar13;
    }
    else {
      lVar4 = 0;
    }
    (piVar12 + lVar4 * 8)[0] = 0;
    (piVar12 + lVar4 * 8)[1] = 0;
    piVar12[lVar4 * 8 + 2] = 0;
    (piVar12 + lVar4 * 8 + 4)[0] = 0;
    (piVar12 + lVar4 * 8 + 4)[1] = 0;
    piVar12[lVar4 * 8 + 6] = 0;
    pbVar22 = (byte *)*argtable;
    sVar5 = 2;
    bVar14 = *pbVar22;
    pbVar9 = pbVar22;
    ppvVar10 = argtable;
    bVar1 = bVar14;
    while ((bVar1 & 1) == 0) {
      ppvVar10 = ppvVar10 + 1;
      if (*(char **)(pbVar9 + 8) == (char *)0x0) {
        lVar4 = 0;
      }
      else {
        sVar7 = strlen(*(char **)(pbVar9 + 8));
        lVar4 = sVar7 * 3;
      }
      sVar5 = sVar5 + lVar4;
      pbVar9 = (byte *)*ppvVar10;
      bVar1 = *pbVar9;
    }
    pcVar6 = (char *)malloc(sVar5);
    if (pcVar6 == (char *)0x0) {
      (*s_panic)("Out of memory!\n");
      pbVar22 = (byte *)*argtable;
      bVar14 = *pbVar22;
    }
    pcVar8 = pcVar6 + 1;
    *pcVar6 = ':';
    if ((bVar14 & 1) == 0) {
      lVar4 = 0;
      do {
        pcVar11 = *(char **)(pbVar22 + 8);
        if (pcVar11 != (char *)0x0) {
          cVar16 = *pcVar11;
          while (cVar16 != '\0') {
            pcVar11 = pcVar11 + 1;
            *pcVar8 = cVar16;
            bVar14 = *pbVar22;
            if ((bVar14 & 2) == 0) {
              pcVar8 = pcVar8 + 1;
            }
            else {
              pcVar8[1] = ':';
              pcVar8 = pcVar8 + 2;
              bVar14 = *pbVar22;
            }
            if ((bVar14 & 4) != 0) {
              *pcVar8 = ':';
              pcVar8 = pcVar8 + 1;
            }
            cVar16 = *pcVar11;
          }
        }
        pbVar22 = (byte *)argtable[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while ((*pbVar22 & 1) == 0);
    }
    *pcVar8 = '\0';
    optind = 0;
    opterr = 0;
LAB_00124fa8:
    iVar15 = getopt_internal(argc,nargv,pcVar6,*(option **)(__ptr + 2),(int *)0x0,1);
    if (0x39 < iVar15) {
      if (iVar15 != 0x3a) {
        if (iVar15 != 0x3f) goto LAB_001250d8;
        iVar15 = endtable->count;
        iVar3 = (endtable->hdr).maxcount;
        piVar12 = endtable->error;
        if (optopt == 0) {
          if (iVar15 < iVar3) {
            pcVar8 = nargv[(long)optind + -1];
            piVar12[iVar15] = 4;
            goto LAB_001251ba;
          }
        }
        else if (iVar15 < iVar3) {
          piVar12[iVar15] = optopt;
          lVar4 = (long)endtable->count;
          endtable->parent[lVar4] = endtable;
          endtable->argval[lVar4] = (char *)0x0;
          goto LAB_001252bb;
        }
        piVar12[(long)iVar3 + -1] = 1;
        goto LAB_001252cf;
      }
      iVar15 = (endtable->hdr).maxcount;
      if (iVar15 <= endtable->count) {
        endtable->error[(long)iVar15 + -1] = 1;
        goto LAB_001252cf;
      }
      pcVar8 = nargv[(long)optind + -1];
      endtable->error[endtable->count] = 5;
LAB_001251ba:
      lVar4 = (long)endtable->count;
      endtable->parent[lVar4] = endtable;
      endtable->argval[lVar4] = pcVar8;
      goto LAB_001252bb;
    }
    if (iVar15 == 0) goto code_r0x0012502e;
    if (iVar15 != -1) {
LAB_001250d8:
      pbVar9 = (byte *)*argtable;
      if ((*pbVar9 & 1) == 0) {
        lVar4 = 0;
        ppvVar10 = argtable + 1;
        do {
          if ((*(char **)(pbVar9 + 8) != (char *)0x0) &&
             (pcVar8 = strchr(*(char **)(pbVar9 + 8),(int)(char)iVar15), pcVar8 != (char *)0x0)) {
            lVar4 = *(long *)((long)argtable + (lVar4 >> 0x1d));
            pcVar2 = *(code **)(lVar4 + 0x40);
            if (pcVar2 == (code *)0x0) goto LAB_00124fa8;
            pvVar17 = *(void **)(lVar4 + 0x30);
            iVar15 = (*pcVar2)(pvVar17,optarg);
            pcVar8 = optarg;
            if (iVar15 == 0) goto LAB_00124fa8;
            iVar3 = (endtable->hdr).maxcount;
            piVar12 = endtable->error;
            if (iVar3 <= endtable->count) goto LAB_001252c7;
            piVar12[endtable->count] = iVar15;
            lVar4 = (long)endtable->count;
            endtable->parent[lVar4] = pvVar17;
            goto LAB_001252b3;
          }
          pbVar9 = (byte *)*ppvVar10;
          lVar4 = lVar4 + 0x100000000;
          ppvVar10 = ppvVar10 + 1;
        } while ((*pbVar9 & 1) == 0);
      }
      iVar3 = (endtable->hdr).maxcount;
      if (endtable->count < iVar3) {
        endtable->error[endtable->count] = iVar15;
        iVar15 = endtable->count;
        endtable->parent[iVar15] = endtable;
        endtable->argval[iVar15] = (char *)0x0;
        endtable->count = iVar15 + 1;
      }
      else {
        endtable->error[(long)iVar3 + -1] = 1;
        lVar4 = (long)(endtable->hdr).maxcount;
        endtable->parent[lVar4 + -1] = endtable;
        endtable->argval[lVar4 + -1] = (char *)0x0;
      }
      goto LAB_00124fa8;
    }
    free(pcVar6);
    free(__ptr);
    pbVar9 = (byte *)*argtable;
    iVar15 = optind;
    if ((*pbVar9 & 1) == 0) {
      lVar4 = 0;
      iVar3 = 0;
      pcVar6 = (char *)0x0;
      pvVar17 = (void *)0x0;
      do {
        while( true ) {
          if (argc <= iVar15) goto LAB_00125475;
          pvVar18 = pvVar17;
          if (((*(long *)(pbVar9 + 0x10) == 0) && (*(long *)(pbVar9 + 8) == 0)) &&
             (*(code **)(pbVar9 + 0x40) != (code *)0x0)) break;
LAB_0012538a:
          pbVar9 = (byte *)argtable[lVar4 + 1];
          lVar4 = lVar4 + 1;
          pvVar17 = pvVar18;
          if ((*pbVar9 & 1) != 0) {
            if (iVar3 != 0) {
              iVar15 = (endtable->hdr).maxcount;
              if (endtable->count < iVar15) {
                endtable->error[endtable->count] = iVar3;
                iVar15 = endtable->count;
                endtable->parent[iVar15] = pvVar18;
                endtable->argval[iVar15] = pcVar6;
                endtable->count = iVar15 + 1;
              }
              else {
                endtable->error[(long)iVar15 + -1] = 1;
                lVar4 = (long)(endtable->hdr).maxcount;
                endtable->parent[lVar4 + -1] = endtable;
                endtable->argval[lVar4 + -1] = (char *)0x0;
              }
              optind = optind + 1;
              iVar15 = optind;
            }
            goto joined_r0x001253ff;
          }
        }
        pvVar18 = *(void **)(pbVar9 + 0x30);
        iVar3 = (**(code **)(pbVar9 + 0x40))(pvVar18,nargv[iVar15]);
        if (iVar3 != 0) {
          pcVar6 = nargv[optind];
          iVar15 = optind;
          goto LAB_0012538a;
        }
        optind = optind + 1;
        pbVar9 = (byte *)argtable[lVar4];
        iVar3 = 0;
        iVar15 = optind;
      } while ((*pbVar9 & 1) == 0);
    }
joined_r0x001253ff:
    while (iVar15 < argc) {
      optind = iVar15 + 1;
      iVar3 = (endtable->hdr).maxcount;
      if (endtable->count < iVar3) {
        pcVar6 = nargv[iVar15];
        endtable->error[endtable->count] = 3;
        iVar15 = endtable->count;
        endtable->parent[iVar15] = endtable;
        endtable->argval[iVar15] = pcVar6;
        endtable->count = iVar15 + 1;
        iVar15 = optind;
      }
      else {
        endtable->error[(long)iVar3 + -1] = 1;
        lVar4 = (long)(endtable->hdr).maxcount;
        endtable->parent[lVar4 + -1] = endtable;
        endtable->argval[lVar4 + -1] = (char *)0x0;
        iVar15 = optind;
      }
    }
LAB_00125475:
    if (endtable->count == 0) {
      arg_parse_check((arg_hdr **)argtable,endtable);
    }
    free(nargv);
  }
  return endtable->count;
code_r0x0012502e:
  iVar15 = *__ptr;
  pvVar17 = *(void **)((long)argtable[iVar15] + 0x30);
  if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*argtable[iVar15] & 2) != 0)) {
    iVar3 = (endtable->hdr).maxcount;
    if (endtable->count < iVar3) {
      pcVar8 = nargv[(long)optind + -1];
      endtable->error[endtable->count] = 5;
      iVar3 = endtable->count;
      endtable->parent[iVar3] = endtable;
      endtable->argval[iVar3] = pcVar8;
      endtable->count = iVar3 + 1;
    }
    else {
      endtable->error[(long)iVar3 + -1] = 1;
      lVar4 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar4 + -1] = endtable;
      endtable->argval[lVar4 + -1] = (char *)0x0;
    }
  }
  if ((*(code **)((long)argtable[iVar15] + 0x40) != (code *)0x0) &&
     (iVar15 = (**(code **)((long)argtable[iVar15] + 0x40))(pvVar17,optarg), pcVar8 = optarg,
     iVar15 != 0)) {
    iVar3 = (endtable->hdr).maxcount;
    piVar12 = endtable->error;
    if (endtable->count < iVar3) {
      piVar12[endtable->count] = iVar15;
      lVar4 = (long)endtable->count;
      endtable->parent[lVar4] = pvVar17;
LAB_001252b3:
      endtable->argval[lVar4] = pcVar8;
LAB_001252bb:
      endtable->count = (int)lVar4 + 1;
    }
    else {
LAB_001252c7:
      piVar12[(long)iVar3 + -1] = 1;
LAB_001252cf:
      lVar4 = (long)(endtable->hdr).maxcount;
      endtable->parent[lVar4 + -1] = endtable;
      endtable->argval[lVar4 + -1] = (char *)0x0;
    }
  }
  goto LAB_00124fa8;
}

Assistant:

int arg_parse(int argc, char** argv, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    struct arg_end* endtable;
    int endindex;
    char** argvcopy = NULL;
    int i;

    /*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

    /* reset any argtable data from previous invocations */
    arg_reset(argtable);

    /* locate the first end-of-table marker within the array */
    endindex = arg_endindex(table);
    endtable = (struct arg_end*)table[endindex];

    /* Special case of argc==0.  This can occur on Texas Instruments DSP. */
    /* Failure to trap this case results in an unwanted NULL result from  */
    /* the malloc for argvcopy (next code block).                         */
    if (argc == 0) {
        /* We must still perform post-parse checks despite the absence of command line arguments */
        arg_parse_check(table, endtable);

        /* Now we are finished */
        return endtable->count;
    }

    argvcopy = (char**)xmalloc(sizeof(char*) * (size_t)(argc + 1));

    /*
        Fill in the local copy of argv[]. We need a local copy
        because getopt rearranges argv[] which adversely affects
        susbsequent parsing attempts.
        */
    for (i = 0; i < argc; i++)
        argvcopy[i] = argv[i];

    argvcopy[argc] = NULL;

    /* parse the command line (local copy) for tagged options */
    arg_parse_tagged(argc, argvcopy, table, endtable);

    /* parse the command line (local copy) for untagged options */
    arg_parse_untagged(argc, argvcopy, table, endtable);

    /* if no errors so far then perform post-parse checks otherwise dont bother */
    if (endtable->count == 0)
        arg_parse_check(table, endtable);

    /* release the local copt of argv[] */
    xfree(argvcopy);

    return endtable->count;
}